

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_record.c
# Opt level: O1

ALCcontext * alcGetCurrentContext(void)

{
  APILOCK();
  IO_ENTRYINFO(ALEE_alcGetCurrentContext);
  (*REAL_alcGetCurrentContext)();
  IO_UINT64((uint64)current_context);
  check_al_async_states();
  APIUNLOCK();
  return (ALCcontext *)current_context;
}

Assistant:

ALCcontext *alcGetCurrentContext(void)
{
    ALCcontext *retval;
    IO_START(alcGetCurrentContext);
    retval = REAL_alcGetCurrentContext();
    (void) retval; // !!! FIXME: assert this hasn't gone out of sync with current_context...
    IO_PTR(current_context);
    IO_END_ALC(NULL);
    return (ALCcontext *) current_context;
}